

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

CharFormat testing::internal::PrintAsStringLiteralTo(char32_t c,ostream *os)

{
  ostream *in_RSI;
  int in_EDI;
  char32_t unaff_retaddr;
  undefined4 in_stack_fffffffffffffffc;
  CharFormat CVar1;
  
  if (in_EDI == 0x22) {
    std::operator<<(in_RSI,"\\\"");
    CVar1 = kSpecialEscape;
  }
  else if (in_EDI == 0x27) {
    std::operator<<(in_RSI,"\'");
    CVar1 = kAsIs;
  }
  else {
    CVar1 = PrintAsCharLiteralTo<char32_t>
                      (unaff_retaddr,(ostream *)CONCAT44(in_stack_fffffffffffffffc,in_EDI));
  }
  return CVar1;
}

Assistant:

static CharFormat PrintAsStringLiteralTo(char32_t c, ostream* os) {
  switch (c) {
    case L'\'':
      *os << "'";
      return kAsIs;
    case L'"':
      *os << "\\\"";
      return kSpecialEscape;
    default:
      return PrintAsCharLiteralTo(c, os);
  }
}